

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall chrono::robosimian::RoboSimian::Create(RoboSimian *this,bool has_sled,bool fixed)

{
  shared_ptr<chrono::ChMaterialSurface> *this_00;
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  *this_01;
  shared_ptr<chrono::ChMaterialSurface> *this_02;
  ChContactMethod contact_method;
  undefined7 in_register_00000031;
  bool fixed_local;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined4 local_40;
  char local_3c;
  shared_ptr<chrono::ChMaterialSurface> *local_38;
  
  _local_3c = (undefined4)CONCAT71(in_register_00000031,has_sled);
  fixed_local = fixed;
  contact_method = (**(code **)(*(long *)this->m_system + 0x178))();
  if (contact_method == NSC) {
    chrono::collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
    chrono::collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
  }
  DefaultContactMaterial((robosimian *)&local_50,contact_method);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_chassis_material).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  DefaultContactMaterial((robosimian *)&local_50,contact_method);
  local_38 = &this->m_sled_material;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_38->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
             &local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  DefaultContactMaterial((robosimian *)&local_50,contact_method);
  this_00 = &this->m_wheel_material;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
             &local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  DefaultContactMaterial((robosimian *)&local_50,contact_method);
  this_02 = &this->m_link_material;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_02->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
             &local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  DefaultContactMaterial((robosimian *)&local_50,contact_method);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_wheelDD_material).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::
  make_shared<chrono::robosimian::RS_Chassis,char_const(&)[8],bool&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            ((char (*) [8])&local_50,(bool *)0x1847bc,
             (shared_ptr<chrono::ChMaterialSurface> *)&fixed_local,
             (ChSystem **)&this->m_chassis_material);
  std::__shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_chassis).
              super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  if (local_3c != '\0') {
    std::
    make_shared<chrono::robosimian::RS_Sled,char_const(&)[5],std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
              ((char (*) [5])&local_50,(shared_ptr<chrono::ChMaterialSurface> *)0x1847de,
               (ChSystem **)local_38);
    std::__shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_sled).
                super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  this_01 = &this->m_limbs;
  local_40 = 0;
  std::
  make_shared<chrono::robosimian::RS_Limb,char_const(&)[6],chrono::robosimian::LimbID,chrono::robosimian::LinkData_const(&)[11],std::shared_ptr<chrono::ChMaterialSurface>&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            ((char (*) [6])&local_50,(LimbID *)"limb1",(LinkData (*) [11])&stack0xffffffffffffffc0,
             (shared_ptr<chrono::ChMaterialSurface> *)front_links,this_00,(ChSystem **)this_02);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
  ::emplace_back<std::shared_ptr<chrono::robosimian::RS_Limb>>
            ((vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
              *)this_01,(shared_ptr<chrono::robosimian::RS_Limb> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  local_40 = 1;
  std::
  make_shared<chrono::robosimian::RS_Limb,char_const(&)[6],chrono::robosimian::LimbID,chrono::robosimian::LinkData_const(&)[11],std::shared_ptr<chrono::ChMaterialSurface>&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            ((char (*) [6])&local_50,(LimbID *)"limb2",(LinkData (*) [11])&stack0xffffffffffffffc0,
             (shared_ptr<chrono::ChMaterialSurface> *)rear_links,this_00,(ChSystem **)this_02);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
  ::emplace_back<std::shared_ptr<chrono::robosimian::RS_Limb>>
            ((vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
              *)this_01,(shared_ptr<chrono::robosimian::RS_Limb> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  local_40 = 2;
  std::
  make_shared<chrono::robosimian::RS_Limb,char_const(&)[6],chrono::robosimian::LimbID,chrono::robosimian::LinkData_const(&)[11],std::shared_ptr<chrono::ChMaterialSurface>&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            ((char (*) [6])&local_50,(LimbID *)"limb3",(LinkData (*) [11])&stack0xffffffffffffffc0,
             (shared_ptr<chrono::ChMaterialSurface> *)rear_links,this_00,(ChSystem **)this_02);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
  ::emplace_back<std::shared_ptr<chrono::robosimian::RS_Limb>>
            ((vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
              *)this_01,(shared_ptr<chrono::robosimian::RS_Limb> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  local_40 = 3;
  std::
  make_shared<chrono::robosimian::RS_Limb,char_const(&)[6],chrono::robosimian::LimbID,chrono::robosimian::LinkData_const(&)[11],std::shared_ptr<chrono::ChMaterialSurface>&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            ((char (*) [6])&local_50,(LimbID *)"limb4",(LinkData (*) [11])&stack0xffffffffffffffc0,
             (shared_ptr<chrono::ChMaterialSurface> *)front_links,this_00,(ChSystem **)this_02);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
  ::emplace_back<std::shared_ptr<chrono::robosimian::RS_Limb>>
            ((vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
              *)this_01,(shared_ptr<chrono::robosimian::RS_Limb> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  SetVisualizationTypeChassis(this,COLLISION);
  SetVisualizationTypeSled(this,COLLISION);
  SetVisualizationTypeLimbs(this,COLLISION);
  return;
}

Assistant:

void RoboSimian::Create(bool has_sled, bool fixed) {
    auto contact_method = m_system->GetContactMethod();

    // Set default collision model envelope commensurate with model dimensions.
    // Note that an SMC system automatically sets envelope to 0.
    if (contact_method == ChContactMethod::NSC) {
        collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
        collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
    }

    // Create the contact materials (all with default properties)
    m_chassis_material = DefaultContactMaterial(contact_method);
    m_sled_material = DefaultContactMaterial(contact_method);
    m_wheel_material = DefaultContactMaterial(contact_method);
    m_link_material = DefaultContactMaterial(contact_method);
    m_wheelDD_material = DefaultContactMaterial(contact_method);

    m_chassis = chrono_types::make_shared<RS_Chassis>("chassis", fixed, m_chassis_material, m_system);

    if (has_sled)
        m_sled = chrono_types::make_shared<RS_Sled>("sled", m_sled_material, m_system);

    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb1", FR, front_links, m_wheel_material, m_link_material, m_system));
    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb2", RR, rear_links, m_wheel_material, m_link_material, m_system));
    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb3", RL, rear_links, m_wheel_material, m_link_material, m_system));
    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb4", FL, front_links, m_wheel_material, m_link_material, m_system));

    // The differential-drive wheels will be removed from robosimian
    ////m_wheel_left = chrono_types::make_shared<RS_WheelDD>("dd_wheel_left", 2, m_wheelDD_material, m_system);
    ////m_wheel_right = chrono_types::make_shared<RS_WheelDD>("dd_wheel_right", 3, m_wheelDD_material, m_system);

    // Default visualization: COLLISION shapes
    SetVisualizationTypeChassis(VisualizationType::COLLISION);
    SetVisualizationTypeSled(VisualizationType::COLLISION);
    SetVisualizationTypeLimbs(VisualizationType::COLLISION);
    SetVisualizationTypeWheels(VisualizationType::COLLISION);
}